

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.cc
# Opt level: O3

int BUF_MEM_reserve(BUF_MEM *buf,size_t cap)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  int iVar3;
  int line;
  ulong new_size;
  
  iVar3 = 1;
  if (buf->max < cap) {
    if (cap < 0xfffffffffffffffd) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = cap + 3;
      if (cap < 0xbffffffffffffffd) {
        new_size = SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
        pcVar2 = (char *)OPENSSL_realloc(buf->data,new_size);
        if (pcVar2 != (char *)0x0) {
          buf->data = pcVar2;
          buf->max = new_size;
          return 1;
        }
        return 0;
      }
      line = 0x32;
    }
    else {
      line = 0x2c;
    }
    iVar3 = 0;
    ERR_put_error(7,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/buf/buf.cc"
                  ,line);
  }
  return iVar3;
}

Assistant:

int BUF_MEM_reserve(BUF_MEM *buf, size_t cap) {
  if (buf->max >= cap) {
    return 1;
  }

  size_t n = cap + 3;
  if (n < cap) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }
  n = n / 3;
  size_t alloc_size = n * 4;
  if (alloc_size / 4 != n) {
    OPENSSL_PUT_ERROR(BUF, ERR_R_OVERFLOW);
    return 0;
  }

  char *new_buf =
      reinterpret_cast<char *>(OPENSSL_realloc(buf->data, alloc_size));
  if (new_buf == NULL) {
    return 0;
  }

  buf->data = new_buf;
  buf->max = alloc_size;
  return 1;
}